

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktOpaqueTypeIndexingTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::shaderexecutor::anon_unknown_0::AtomicCounterIndexingCase::createInstance
          (AtomicCounterIndexingCase *this,Context *ctx)

{
  ShaderType SVar1;
  IndexExprType IVar2;
  Context *pCVar3;
  TestInstance *pTVar4;
  
  pTVar4 = (TestInstance *)operator_new(0x40);
  SVar1 = (this->super_OpaqueTypeIndexingCase).m_shaderType;
  pCVar3 = (Context *)(this->super_OpaqueTypeIndexingCase).m_name;
  IVar2 = (this->super_OpaqueTypeIndexingCase).m_indexExprType;
  pTVar4->m_context = ctx;
  pTVar4[1]._vptr_TestInstance = (_func_int **)ctx->m_testCtx;
  *(ShaderType *)&pTVar4[1].m_context = SVar1;
  pTVar4[2]._vptr_TestInstance = (_func_int **)&(this->super_OpaqueTypeIndexingCase).m_shaderSpec;
  pTVar4[2].m_context = pCVar3;
  *(IndexExprType *)&pTVar4[3]._vptr_TestInstance = IVar2;
  pTVar4->_vptr_TestInstance = (_func_int **)&PTR__TestInstance_00c22448;
  pTVar4[3].m_context = (Context *)&this->m_opIndices;
  return pTVar4;
}

Assistant:

TestInstance* AtomicCounterIndexingCase::createInstance (Context& ctx) const
{
	return new AtomicCounterIndexingCaseInstance(ctx,
												 m_shaderType,
												 m_shaderSpec,
												 m_name,
												 m_opIndices,
												 m_indexExprType);
}